

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbor.cpp
# Opt level: O3

Error * __thiscall ot::commissioner::CborMap::Init(Error *__return_storage_ptr__,CborMap *this)

{
  cn_cbor *pcVar1;
  char *pcVar2;
  char *begin;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  format_args args;
  string local_68;
  format_string_checker<char> local_48;
  
  if ((this->super_CborValue).mCbor != (cn_cbor *)0x0) {
    __assert_fail("condition",
                  "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/cbor.cpp"
                  ,99,"virtual Error ot::commissioner::CborMap::Init()");
  }
  (this->super_CborValue).mIsRoot = true;
  pcVar1 = cn_cbor_map_create((cn_cbor_errback *)0x0);
  (this->super_CborValue).mCbor = pcVar1;
  if (pcVar1 == (cn_cbor *)0x0) {
    local_48.types_[0] = none_type;
    local_48.context_.super_basic_format_parse_context<char>.format_str_.data_ = "create CBOR map";
    local_48.context_.super_basic_format_parse_context<char>.format_str_.size_ = 0xf;
    local_48.context_.super_basic_format_parse_context<char>.next_arg_id_ = 0;
    local_48.context_.super_basic_format_parse_context<char>._20_4_ = 0;
    local_48.parse_funcs_[0] = (parse_func)0x0;
    begin = "create CBOR map";
    local_48.context_.types_ = local_48.types_;
    do {
      pcVar2 = begin + 1;
      if (*begin == '}') {
        if ((pcVar2 == "") || (*pcVar2 != '}')) {
          fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
        }
        pcVar2 = begin + 2;
      }
      else if (*begin == '{') {
        pcVar2 = fmt::v10::detail::
                 parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                           (begin,"",&local_48);
      }
      begin = pcVar2;
    } while (pcVar2 != "");
    args.field_1.args_ = in_R9.args_;
    args.desc_ = (unsigned_long_long)&local_48;
    fmt::v10::vformat_abi_cxx11_(&local_68,(v10 *)"create CBOR map",(string_view)ZEXT816(0xf),args);
    __return_storage_ptr__->mCode = kOutOfMemory;
    (__return_storage_ptr__->mMessage)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->mMessage).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&__return_storage_ptr__->mMessage,local_68._M_dataplus._M_p,
               local_68._M_dataplus._M_p + local_68._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p);
    }
  }
  else {
    __return_storage_ptr__->mCode = kNone;
    (__return_storage_ptr__->mMessage)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->mMessage).field_2;
    (__return_storage_ptr__->mMessage)._M_string_length = 0;
    (__return_storage_ptr__->mMessage).field_2._M_local_buf[0] = '\0';
  }
  return __return_storage_ptr__;
}

Assistant:

Error CborMap::Init(void)
{
    ASSERT(mCbor == nullptr);
    mIsRoot = true;
    mCbor   = cn_cbor_map_create(nullptr);
    return mCbor ? ERROR_NONE : ERROR_OUT_OF_MEMORY("create CBOR map");
}